

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

int __thiscall
CVmGramProdState::clone
          (CVmGramProdState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  vm_obj_id_t vVar1;
  vmgram_alt_info *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  long local_38;
  
  if (this->enclosing_ == (CVmGramProdState *)0x0) {
    local_38 = 0;
  }
  else {
    iVar5 = clone(this->enclosing_,__fn,__child_stack,__flags,__arg);
    local_38 = CONCAT44(extraout_var,iVar5);
  }
  sVar3 = this->tok_pos_;
  sVar4 = this->alt_pos_;
  pvVar2 = this->altp_;
  vVar1 = this->prod_obj_;
  iVar5 = this->circular_alt_;
  plVar6 = (long *)CVmGramProdMem::alloc((CVmGramProdMem *)__fn,pvVar2->tok_cnt * 8 + 0x40);
  *plVar6 = (long)(int)sVar3;
  plVar6[2] = (long)(int)sVar4;
  *(undefined4 *)(plVar6 + 1) = 0;
  plVar6[3] = local_38;
  plVar6[4] = (long)pvVar2;
  *(vm_obj_id_t *)(plVar6 + 5) = vVar1;
  *(int *)(plVar6 + 7) = iVar5;
  *(undefined2 *)((long)plVar6 + 0x2c) = 0;
  plVar6[6] = 0;
  *(vm_prop_id_t *)((long)plVar6 + 0x2c) = this->sub_target_prop_;
  if (this->alt_pos_ != 0) {
    memcpy(plVar6 + 8,this->match_list_,this->alt_pos_ << 3);
  }
  plVar6[6] = 0;
  *(int *)(plVar6 + 1) = this->matched_star_;
  return (int)plVar6;
}

Assistant:

CVmGramProdState *clone(CVmGramProdMem *mem)
    {
        CVmGramProdState *new_state;
        CVmGramProdState *new_enclosing;

        /* clone our enclosing state */
        new_enclosing = (enclosing_ != 0 ? enclosing_->clone(mem) : 0);
        
        /* create a new state object */
        new_state = alloc(mem, tok_pos_, alt_pos_, new_enclosing,
                          altp_, prod_obj_, circular_alt_);

        /* copy the target sub-production property */
        new_state->sub_target_prop_ = sub_target_prop_;

        /* copy the valid portion of my match list */
        if (alt_pos_ != 0)
            memcpy(new_state->match_list_, match_list_,
                   alt_pos_ * sizeof(match_list_[0]));

        /* we're not yet in any queue */
        new_state->nxt_ = 0;

        /* set the '*' flag in the cloned state */
        new_state->matched_star_ = matched_star_;

        /* return the clone */
        return new_state;
    }